

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall mario::Connector::connecting(Connector *this,int sockfd)

{
  int *piVar1;
  Channel *pCVar2;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->_state = kConnecting;
  pCVar2 = (Channel *)operator_new(0xa0);
  Channel::Channel(pCVar2,this->_loop,sockfd);
  std::__uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>::reset
            ((__uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_> *)
             &this->_channel,pCVar2);
  pCVar2 = (this->_channel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = handleWrite;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Connector **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::Connector::*(mario::Connector_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::Connector::*(mario::Connector_*))()>_>
             ::_M_manager;
  std::function<void_()>::operator=(&pCVar2->_writeCallback,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pCVar2 = (this->_channel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = handleError;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Connector **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::Connector::*(mario::Connector_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::Connector::*(mario::Connector_*))()>_>
             ::_M_manager;
  std::function<void_()>::operator=(&pCVar2->_errorCallback,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pCVar2 = (this->_channel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  piVar1 = &pCVar2->_events;
  *piVar1 = *piVar1 | 4;
  Channel::update(pCVar2);
  return;
}

Assistant:

void Connector::connecting(int sockfd) {
    setState(kConnecting);
    _channel.reset(new Channel(_loop, sockfd));
    _channel->setWriteCallback(
            std::bind(&Connector::handleWrite, this)
            );
    _channel->setErrorCallback(
            std::bind(&Connector::handleError, this)
            );
    _channel->enableWriting();
}